

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffiimg(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  long in_RCX;
  int in_EDX;
  int *in_R8;
  int ii;
  LONGLONG tnaxes [99];
  int local_34c;
  undefined8 local_348 [41];
  int *in_stack_fffffffffffffe00;
  LONGLONG *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  fitsfile *in_stack_fffffffffffffe18;
  int local_4;
  
  if (*in_R8 < 1) {
    if (in_EDX < 100) {
      for (local_34c = 0; local_34c < in_EDX; local_34c = local_34c + 1) {
        local_348[local_34c] = *(undefined8 *)(in_RCX + (long)local_34c * 8);
      }
      ffiimgll(in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      local_4 = *in_R8;
    }
    else {
      ffpmsg((char *)0x1376e6);
      *in_R8 = 0xd4;
      local_4 = 0xd4;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffiimg(fitsfile *fptr,      /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           long *naxes,         /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
  insert an IMAGE extension following the current HDU 
*/
{
    LONGLONG tnaxes[99];
    int ii;
    
    if (*status > 0)
        return(*status);

    if (naxis > 99) {
        ffpmsg("NAXIS value is too large (>99)  (ffiimg)");
	return(*status = 212);
    }

    for (ii = 0; (ii < naxis); ii++)
       tnaxes[ii] = naxes[ii];
       
    ffiimgll(fptr, bitpix, naxis, tnaxes, status);

    return(*status);
}